

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_cop1_ldst(DisasContext_conflict6 *ctx,uint32_t op,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  uintptr_t o;
  TCGv_i64 addr;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  addr = (TCGv_i64)((long)pTVar1 - (long)s);
  if ((ctx->CP0_Config1 & 1) == 0) {
    generate_exception_err(ctx,0x13,1);
  }
  else {
    if ((ctx->hflags & 0x20) == 0) {
      generate_exception_err(ctx,0x13,1);
    }
    if (((op | 0x20000000) == 0xf4000000) && ((ctx->insn_flags & 2) == 0)) {
      generate_exception_err(ctx,0x14,0);
    }
    gen_base_offset_addr(ctx,addr,rs,(int)imm);
    gen_flt_ldst(ctx,op,rt,addr);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(addr + (long)s));
  return;
}

Assistant:

static void gen_cop1_ldst(DisasContext *ctx, uint32_t op, int rt,
                          int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    if (ctx->CP0_Config1 & (1 << CP0C1_FP)) {
        check_cp1_enabled(ctx);
        switch (op) {
        case OPC_LDC1:
        case OPC_SDC1:
            check_insn(ctx, ISA_MIPS2);
            /* Fallthrough */
        default:
            gen_base_offset_addr(ctx, t0, rs, imm);
            gen_flt_ldst(ctx, op, rt, t0);
        }
    } else {
        generate_exception_err(ctx, EXCP_CpU, 1);
    }
    tcg_temp_free(tcg_ctx, t0);
}